

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int TPZMatrix<Fad<double>_>::Error(char *msg,char *msg2)

{
  ostream *poVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *in_RSI;
  char *in_RDI;
  bad_exception myex;
  ostringstream out;
  bad_exception *in_stack_fffffffffffffde8;
  bad_exception *this;
  bad_exception local_1e0 [8];
  string local_1d8 [32];
  string local_1b8 [48];
  ostringstream local_188 [376];
  char *local_10;
  char *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = std::operator<<((ostream *)local_188,"TPZMatrix::");
  std::operator<<(poVar1,local_8);
  if (local_10 != (char *)0x0) {
    std::operator<<((ostream *)local_188,local_10);
  }
  std::operator<<((ostream *)local_188,".\n");
  std::__cxx11::ostringstream::str();
  poVar1 = std::operator<<((ostream *)&std::cout,local_1b8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::str();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1d8);
  pzinternal::DebugStopImpl(msg,(size_t)msg2);
  this = local_1e0;
  std::bad_exception::bad_exception(this);
  uVar3 = __cxa_allocate_exception(8);
  std::bad_exception::bad_exception(this,in_stack_fffffffffffffde8);
  __cxa_throw(uVar3,&std::bad_exception::typeinfo,std::bad_exception::~bad_exception);
}

Assistant:

int TPZMatrix<TVar>::Error(const char *msg ,const char *msg2) {
  ostringstream out;
  out << "TPZMatrix::" << msg;
  if(msg2) out << msg2;
  out << ".\n";
  std::cout<<out.str()<<std::endl;
  LOGPZ_ERROR (logger, out.str().c_str());
  DebugStop();
	std::bad_exception myex;
	throw myex;
}